

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O1

void __thiscall helics::ValueFederate::loadFederateData(ValueFederate *this)

{
  LocalFederateId id;
  _func_int *p_Var1;
  Core *coreOb;
  _func_int **pp_Var2;
  ValueFederateManager *this_00;
  pointer __p;
  __uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
  local_30;
  
  p_Var1 = this->_vptr_ValueFederate[-3];
  coreOb = *(Core **)(&this->field_0x18 + (long)p_Var1);
  id.fid = *(BaseType *)(&this->field_0x10 + (long)p_Var1);
  this_00 = (ValueFederateManager *)operator_new(0x3c8);
  ValueFederateManager::ValueFederateManager
            (this_00,coreOb,this,id,(bool)(p_Var1 + 6)[(long)&(this->vfManager)._M_t]);
  local_30._M_t.
  super__Tuple_impl<0UL,_helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>
  .super__Head_base<0UL,_helics::ValueFederateManager_*,_false>._M_head_impl =
       (tuple<helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>)
       (_Tuple_impl<0UL,_helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>
        )0x0;
  std::
  __uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
  ::reset((__uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
           *)&this->vfManager,this_00);
  std::unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
  ::~unique_ptr((unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                 *)&local_30);
  pp_Var2 = this->_vptr_ValueFederate;
  ((this->vfManager)._M_t.
   super___uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
   ._M_t.
   super__Tuple_impl<0UL,_helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>
   .super__Head_base<0UL,_helics::ValueFederateManager_*,_false>._M_head_impl)->useJsonSerialization
       = (bool)(pp_Var2[-3] + 3)[(long)&(this->vfManager)._M_t];
  p_Var1 = pp_Var2[-3];
  if (*(long *)(&this->field_0x40 + (long)p_Var1) != 0) {
    registerValueInterfaces(this,(string *)(&this->field_0x38 + (long)p_Var1));
  }
  return;
}

Assistant:

void ValueFederate::loadFederateData()
{
    vfManager = std::make_unique<ValueFederateManager>(coreObject.get(),
                                                       this,
                                                       getID(),
                                                       singleThreadFederate);
    vfManager->useJsonSerialization = useJsonSerialization;
    if (!configFile.empty()) {
        ValueFederate::registerValueInterfaces(configFile);
    }
}